

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_descriptor_set_layout
               (StateRecorder *recorder,VkDescriptorSetLayoutCreateInfo *layout,Hash *out_hash)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  Hasher h;
  Hash hash;
  Hasher local_48;
  ulong *local_40;
  ulong local_38;
  
  local_48.h = ((ulong)layout->bindingCount ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^
               (ulong)layout->flags;
  local_40 = out_hash;
  if (layout->bindingCount != 0) {
    uVar3 = 0;
    do {
      pVVar1 = layout->pBindings;
      local_48.h = ((ulong)pVVar1[uVar3].descriptorType ^
                   ((local_48.h * 0x100000001b3 ^ (ulong)pVVar1[uVar3].binding) * 0x100000001b3 ^
                   (ulong)pVVar1[uVar3].descriptorCount) * 0x100000001b3) * 0x100000001b3 ^
                   (ulong)pVVar1[uVar3].stageFlags;
      if ((pVVar1[uVar3].descriptorType < VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE &&
           pVVar1[uVar3].pImmutableSamplers != (VkSampler *)0x0) &&
         (pVVar1[uVar3].descriptorCount != 0)) {
        uVar4 = 0;
        do {
          bVar2 = StateRecorder::get_hash_for_sampler
                            (recorder,pVVar1[uVar3].pImmutableSamplers[uVar4],&local_38);
          if (!bVar2) {
            return false;
          }
          local_48.h = (local_38 & 0xffffffff ^ local_48.h * 0x100000001b3) * 0x100000001b3 ^
                       local_38 >> 0x20;
          uVar4 = uVar4 + 1;
        } while (uVar4 < pVVar1[uVar3].descriptorCount);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < layout->bindingCount);
  }
  bVar2 = hash_pnext_chain(recorder,&local_48,layout->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar2) {
    *local_40 = local_48.h;
  }
  return bVar2;
}

Assistant:

bool compute_hash_descriptor_set_layout(const StateRecorder &recorder, const VkDescriptorSetLayoutCreateInfo &layout, Hash *out_hash)
{
	Hasher h;

	h.u32(layout.bindingCount);
	h.u32(layout.flags);
	for (uint32_t i = 0; i < layout.bindingCount; i++)
	{
		auto &binding = layout.pBindings[i];
		h.u32(binding.binding);
		h.u32(binding.descriptorCount);
		h.u32(binding.descriptorType);
		h.u32(binding.stageFlags);

		if (binding.pImmutableSamplers &&
			(binding.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER ||
		    binding.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER))
		{
			for (uint32_t j = 0; j < binding.descriptorCount; j++)
			{
				Hash hash;
				if (!recorder.get_hash_for_sampler(binding.pImmutableSamplers[j], &hash))
					return false;
				h.u64(hash);
			}
		}
	}

	if (!hash_pnext_chain(&recorder, h, layout.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}